

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_seeall(lua_State *L)

{
  int iVar1;
  undefined8 in_RDI;
  lua_State *in_stack_00000008;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  lua_State *in_stack_00000028;
  int in_stack_00000034;
  lua_State *in_stack_00000038;
  
  luaL_checktype(L,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  iVar1 = lua_getmetatable((lua_State *)CONCAT44(in_stack_00000024,in_stack_00000020),
                           in_stack_0000001c);
  if (iVar1 == 0) {
    lua_createtable(in_stack_00000028,in_stack_00000024,in_stack_00000020);
    lua_pushvalue(in_stack_00000008,L._4_4_);
    lua_setmetatable(in_stack_00000028,in_stack_00000024);
  }
  lua_pushvalue(in_stack_00000008,L._4_4_);
  lua_setfield(in_stack_00000038,in_stack_00000034,(char *)in_stack_00000028);
  return 0;
}

Assistant:

static int lj_cf_package_seeall(lua_State *L)
{
  luaL_checktype(L, 1, LUA_TTABLE);
  if (!lua_getmetatable(L, 1)) {
    lua_createtable(L, 0, 1); /* create new metatable */
    lua_pushvalue(L, -1);
    lua_setmetatable(L, 1);
  }
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  lua_setfield(L, -2, "__index");  /* mt.__index = _G */
  return 0;
}